

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_compare.c
# Opt level: O1

int mpt_value_compare(mpt_value *val,void *cmp)

{
  int iVar1;
  mpt_type_traits *pmVar2;
  
  pmVar2 = mpt_type_traits(val->_type);
  if (pmVar2 == (mpt_type_traits *)0x0) {
    iVar1 = -3;
  }
  else {
    iVar1 = (int)pmVar2->size;
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = memcmp(val->_addr,cmp,(long)iVar1);
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_value_compare(const MPT_STRUCT(value) *val, const void *cmp)
{
	const MPT_STRUCT(type_traits) *traits;
	int pos;
	
	if (!(traits = mpt_type_traits(val->_type))) {
		return MPT_ERROR(BadType);
	}
	if (!(pos = traits->size)) {
		return 0;
	}
	pos = memcmp(val->_addr, cmp, pos);
	
	return pos < 0 ? -pos : pos;
}